

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O0

natwm_error string_find_first_nonspace(char *string,size_t *index_result)

{
  char cVar1;
  ushort **ppuVar2;
  bool bVar3;
  size_t local_30;
  size_t index;
  char ch;
  size_t *index_result_local;
  char *string_local;
  
  if (string == (char *)0x0) {
    string_local._4_4_ = INVALID_INPUT_ERROR;
  }
  else {
    local_30 = 0;
    while( true ) {
      cVar1 = string[local_30];
      bVar3 = false;
      if (cVar1 != '\0') {
        ppuVar2 = __ctype_b_loc();
        bVar3 = ((*ppuVar2)[(int)cVar1] & 0x2000) != 0;
      }
      if (!bVar3) break;
      local_30 = local_30 + 1;
    }
    if (cVar1 == '\0') {
      string_local._4_4_ = NOT_FOUND_ERROR;
    }
    else {
      *index_result = local_30;
      string_local._4_4_ = NO_ERROR;
    }
  }
  return string_local._4_4_;
}

Assistant:

enum natwm_error string_find_first_nonspace(const char *string, size_t *index_result)
{
        if (string == NULL) {
                return INVALID_INPUT_ERROR;
        }

        char ch = '\0';
        size_t index = 0;

        while ((ch = string[index]) != '\0' && isspace(ch)) {
                ++index;
        }

        if (ch == '\0') {
                // Reached the end of the line without finding a nonspace char
                return NOT_FOUND_ERROR;
        }

        *index_result = index;

        return NO_ERROR;
}